

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O0

void __thiscall RTIMUMagCal::setMinMaxCal(RTIMUMagCal *this)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  float delta;
  float maxDelta;
  RTIMUMagCal *this_local;
  
  i = -0x40800000;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    RVar1 = RTVector3::data(&this->m_magMax,local_1c);
    RVar2 = RTVector3::data(&this->m_magMin,local_1c);
    if ((float)i < RVar1 - RVar2) {
      RVar1 = RTVector3::data(&this->m_magMax,local_1c);
      RVar2 = RTVector3::data(&this->m_magMin,local_1c);
      i = (int)(RVar1 - RVar2);
    }
  }
  if (0.0 <= (float)i) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      RVar1 = RTVector3::data(&this->m_magMax,local_20);
      RVar2 = RTVector3::data(&this->m_magMin,local_20);
      RTVector3::setData(&this->m_minMaxScale,local_20,((float)i / 2.0) / ((RVar1 - RVar2) / 2.0));
      RVar1 = RTVector3::data(&this->m_magMax,local_20);
      RVar2 = RTVector3::data(&this->m_magMin,local_20);
      RTVector3::setData(&this->m_minMaxOffset,local_20,(RVar1 + RVar2) / 2.0);
    }
  }
  else {
    fprintf(_stderr,"Error in min/max calibration data\n");
  }
  return;
}

Assistant:

void RTIMUMagCal::setMinMaxCal()
{
    float maxDelta = -1;
    float delta;

    //  find biggest range

    for (int i = 0; i < 3; i++) {
        if ((m_magMax.data(i) - m_magMin.data(i)) > maxDelta)
            maxDelta = m_magMax.data(i) - m_magMin.data(i);
    }
    if (maxDelta < 0) {
        HAL_ERROR("Error in min/max calibration data\n");
        return;
    }
    maxDelta /= 2.0f;                                       // this is the max +/- range

    for (int i = 0; i < 3; i++) {
        delta = (m_magMax.data(i) -m_magMin.data(i)) / 2.0f;
        m_minMaxScale.setData(i, maxDelta / delta);            // makes everything the same range
        m_minMaxOffset.setData(i, (m_magMax.data(i) + m_magMin.data(i)) / 2.0f);
    }
}